

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_revision(lysp_yang_ctx *ctx,lysp_revision **revs)

{
  LY_ERR LVar1;
  lysp_revision *__dest;
  char *pcVar2;
  ly_ctx *local_a0;
  ly_ctx *local_88;
  ly_ctx *local_80;
  ly_ctx *local_78;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  undefined8 *puStack_58;
  LY_ERR ret__;
  char *p__;
  lysp_revision *rev;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_revision **pplStack_20;
  LY_ERR ret;
  lysp_revision **revs_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = revs;
  revs_local = (lysp_revision **)ctx;
  if (*revs == (lysp_revision *)0x0) {
    puStack_58 = (undefined8 *)malloc(0x30);
    if (puStack_58 == (undefined8 *)0x0) {
      if (revs_local == (lysp_revision **)0x0) {
        local_80 = (ly_ctx *)0x0;
      }
      else {
        local_80 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(revs_local[7]->date + 8) +
                      (ulong)(*(int *)(revs_local[7]->date + 4) - 1) * 8);
      }
      ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_revision");
      return LY_EMEM;
    }
    *puStack_58 = 1;
  }
  else {
    (*revs)[-1].exts = (lysp_ext_instance *)((long)&((*revs)[-1].exts)->name + 1);
    puStack_58 = (undefined8 *)realloc(&(*revs)[-1].exts,(long)(*revs)[-1].exts * 0x28 + 8);
    if (puStack_58 == (undefined8 *)0x0) {
      (*pplStack_20)[-1].exts = (lysp_ext_instance *)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
      if (revs_local == (lysp_revision **)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(revs_local[7]->date + 8) +
                      (ulong)(*(int *)(revs_local[7]->date + 4) - 1) * 8);
      }
      ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_revision");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_revision *)(puStack_58 + 1);
  __dest = *pplStack_20 + (long)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
  memset(__dest,0,0x28);
  LVar1 = get_argument((lysp_yang_ctx *)revs_local,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,
                       &word,&stack0xffffffffffffffc0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  LVar1 = lysp_check_date((lysp_ctx *)revs_local,(char *)word_len,sStack_40,"revision");
  if (LVar1 != LY_SUCCESS) {
    free(word);
    return LY_EVALID;
  }
  strncpy(__dest->date,(char *)word_len,sStack_40);
  free(word);
  buf._4_4_ = get_keyword((lysp_yang_ctx *)revs_local,(ly_stmt *)((long)&rev + 4),(char **)&word_len
                          ,&stack0xffffffffffffffc0);
  if (buf._4_4_ == LY_SUCCESS) {
    if (rev._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
      ret___2._3_1_ = 1;
      LVar1 = LY_SUCCESS;
    }
    else {
      if (rev._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (revs_local == (lysp_revision **)0x0) {
          local_88 = (ly_ctx *)0x0;
        }
        else {
          local_88 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(revs_local[7]->date + 8) +
                        (ulong)(*(int *)(revs_local[7]->date + 4) - 1) * 8);
        }
        pcVar2 = lyplg_ext_stmt2str(rev._4_4_);
        ly_vlog(local_88,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
        return LY_EVALID;
      }
      LVar1 = get_keyword((lysp_yang_ctx *)revs_local,(ly_stmt *)((long)&rev + 4),(char **)&word_len
                          ,&stack0xffffffffffffffc0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      ret___2._3_1_ = rev._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
      LVar1 = LY_SUCCESS;
    }
    while( true ) {
      buf._4_4_ = LVar1;
      if ((bool)ret___2._3_1_) {
        return buf._4_4_;
      }
      if (rev._4_4_ == LY_STMT_DESCRIPTION) {
        LVar1 = parse_text_field((lysp_yang_ctx *)revs_local,__dest->dsc,LY_STMT_DESCRIPTION,0,
                                 &__dest->dsc,Y_STR_ARG,(uint16_t *)0x0,&__dest->exts);
      }
      else if (rev._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
        LVar1 = parse_ext((lysp_yang_ctx *)revs_local,(char *)word_len,sStack_40,__dest,
                          LY_STMT_REVISION,0,&__dest->exts);
      }
      else {
        if (rev._4_4_ != LY_STMT_REFERENCE) {
          if (revs_local == (lysp_revision **)0x0) {
            local_a0 = (ly_ctx *)0x0;
          }
          else {
            local_a0 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(revs_local[7]->date + 8) +
                          (ulong)(*(int *)(revs_local[7]->date + 4) - 1) * 8);
          }
          pcVar2 = lyplg_ext_stmt2str(rev._4_4_);
          ly_vlog(local_a0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"revision");
          return LY_EVALID;
        }
        LVar1 = parse_text_field((lysp_yang_ctx *)revs_local,__dest->ref,LY_STMT_REFERENCE,0,
                                 &__dest->ref,Y_STR_ARG,(uint16_t *)0x0,&__dest->exts);
      }
      if (LVar1 != LY_SUCCESS) break;
      buf._4_4_ = get_keyword((lysp_yang_ctx *)revs_local,(ly_stmt *)((long)&rev + 4),
                              (char **)&word_len,&stack0xffffffffffffffc0);
      if (buf._4_4_ != LY_SUCCESS) {
        return buf._4_4_;
      }
      LVar1 = LY_SUCCESS;
      if (rev._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
        if ((__dest->exts != (lysp_ext_instance *)0x0) &&
           (LVar1 = ly_set_add((ly_set *)(revs_local[8] + 1),__dest->exts,'\x01',(uint32_t *)0x0),
           LVar1 != LY_SUCCESS)) {
          return LVar1;
        }
        buf._4_4_ = LVar1;
        ret___2._3_1_ = true;
        LVar1 = buf._4_4_;
      }
    }
    return LVar1;
  }
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_revision(struct lysp_yang_ctx *ctx, struct lysp_revision **revs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_revision *rev;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *revs, rev, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len));

    /* check value */
    if (lysp_check_date((struct lysp_ctx *)ctx, word, word_len, "revision")) {
        free(buf);
        return LY_EVALID;
    }

    strncpy(rev->date, word, word_len);
    free(buf);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, rev->dsc, LY_STMT_DESCRIPTION, 0, &rev->dsc, Y_STR_ARG, NULL, &rev->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, rev->ref, LY_STMT_REFERENCE, 0, &rev->ref, Y_STR_ARG, NULL, &rev->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, rev, LY_STMT_REVISION, 0, &rev->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "revision");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, rev->exts, ret, cleanup);
    }

cleanup:
    return ret;
}